

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_ops.h
# Opt level: O2

vec<float,_2UL> hmi::operator+(vec<float,_2UL> lhs,vec<float,_2UL> rhs)

{
  size_t i;
  long lVar1;
  vec<float,_2UL> rhs_local;
  vec<float,_2UL> lhs_local;
  vec<float,_2UL> result;
  
  lhs_local = lhs;
  rhs_local = rhs;
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    result.field_0.data[lVar1] = lhs_local.field_0.data[lVar1] + rhs_local.field_0.data[lVar1];
  }
  return (vec<float,_2UL>)result.field_0;
}

Assistant:

constexpr
  vec<std::common_type_t<T,U>,N> operator+(vec<T,N> lhs, vec<U,N> rhs) noexcept {
    vec<std::common_type_t<T,U>,N> result;

    for (std::size_t i = 0; i < N; ++i) {
      result[i] = lhs[i] + rhs[i];
    }

    return result;
  }